

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_obj_loader.h
# Opt level: O0

bool tinyobj::fixIndex(int idx,int n,int *ret)

{
  int *ret_local;
  int n_local;
  int idx_local;
  
  if (ret == (int *)0x0) {
    n_local._3_1_ = false;
  }
  else if (idx < 1) {
    if (idx == 0) {
      n_local._3_1_ = false;
    }
    else if (idx < 0) {
      *ret = n + idx;
      n_local._3_1_ = true;
    }
    else {
      n_local._3_1_ = false;
    }
  }
  else {
    *ret = idx + -1;
    n_local._3_1_ = true;
  }
  return n_local._3_1_;
}

Assistant:

static inline bool fixIndex(int idx, int n, int *ret) {
  if (!ret) {
    return false;
  }

  if (idx > 0) {
    (*ret) = idx - 1;
    return true;
  }

  if (idx == 0) {
    // zero is not allowed according to the spec.
    return false;
  }

  if (idx < 0) {
    (*ret) = n + idx;  // negative value = relative
    return true;
  }

  return false;  // never reach here.
}